

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer.h
# Opt level: O1

void __thiscall
google::protobuf::util::MessageDifferencer::MapEntryKeyComparator::~MapEntryKeyComparator
          (MapEntryKeyComparator *this)

{
  operator_delete(this,0x10);
  return;
}

Assistant:

class PROTOBUF_EXPORT MapEntryKeyComparator : public MapKeyComparator {
   public:
    explicit MapEntryKeyComparator(MessageDifferencer* message_differencer);
    bool IsMatch(
        const Message& message1, const Message& message2, int unpacked_any,
        const std::vector<SpecificField>& parent_fields) const override;

   private:
    MessageDifferencer* message_differencer_;
  }